

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  bool bVar1;
  anon_enum_32 *v1;
  anon_enum_32 *v2;
  char *pcVar2;
  LogMessage *pLVar3;
  CppType *pCVar4;
  CppType *pCVar5;
  LogMessage local_b8;
  Voidify local_a1;
  CppType local_a0;
  CppType local_9c;
  Nullable<const_char_*> local_98;
  LogMessage local_90;
  Voidify local_79;
  anon_enum_32 local_78;
  anon_enum_32 local_74;
  Nullable<const_char_*> local_70;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_58;
  Voidify local_41;
  CppType local_40;
  CppType local_3c;
  Nullable<const_char_*> local_38;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType local_15;
  int value_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local._4_4_ = value;
  local_15 = type;
  value_local = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,(Extension **)&absl_log_internal_check_op_result)
  ;
  if (bVar1) {
    absl_log_internal_check_op_result[8] = local_15;
    local_3c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar4 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_3c);
    local_40 = CPPTYPE_ENUM;
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_40);
    local_38 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar4,pCVar5,"cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM")
    ;
    if (local_38 != (Nullable<const_char_*>)0x0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_38);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,499,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_58);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_41,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_58);
    }
    absl_log_internal_check_op_result[9] = '\0';
    absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfe;
  }
  else {
    local_74 = (anon_enum_32)((absl_log_internal_check_op_result[9] & 1U) == 0);
    v1 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_74);
    local_78 = OPTIONAL_FIELD;
    v2 = absl::lts_20250127::log_internal::
         GetReferenceableValue<google::protobuf::internal::(anonymous_namespace)::__1>(&local_78);
    local_70 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                         (v1,v2,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
    if (local_70 != (Nullable<const_char_*>)0x0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_70);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1f7,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_90);
    }
    local_9c = anon_unknown_59::cpp_type(absl_log_internal_check_op_result[8]);
    pCVar4 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_9c);
    local_a0 = CPPTYPE_ENUM;
    pCVar5 = absl::lts_20250127::log_internal::
             GetReferenceableValue<google::protobuf::internal::WireFormatLite::CppType>(&local_a0);
    local_98 = absl::lts_20250127::log_internal::
               Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                         (pCVar4,pCVar5,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    if (local_98 != (Nullable<const_char_*>)0x0) {
      pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_98);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1f7,pcVar2);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a1,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_b8);
    }
  }
  absl_log_internal_check_op_result[10] = absl_log_internal_check_op_result[10] & 0xfd;
  *(int *)absl_log_internal_check_op_result = descriptor_local._4_4_;
  return;
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
    extension->is_pointer = false;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}